

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::EndMenu(void)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  
  pIVar3 = GImGui;
  if (GImGui->NavMoveDir == 0) {
    pIVar1 = GImGui->CurrentWindow;
    bVar4 = NavMoveRequestButNoResultYet();
    if ((((bVar4) && ((pIVar1->DC).LayoutType == 1)) &&
        (pIVar2 = pIVar3->NavWindow, pIVar2 != (ImGuiWindow *)0x0)) &&
       ((pIVar2 = pIVar2->RootWindowForNav, (pIVar2->Flags & 0x4000000) != 0 &&
        (pIVar2->ParentWindow == pIVar1)))) {
      ClosePopupToLevel((pIVar3->BeginPopupStack).Size,true);
      NavMoveRequestCancel();
    }
  }
  EndPopup();
  return;
}

Assistant:

void ImGui::EndMenu()
{
    // Nav: When a left move request _within our child menu_ failed, close ourselves (the _parent_ menu).
    // A menu doesn't close itself because EndMenuBar() wants the catch the last Left<>Right inputs.
    // However, it means that with the current code, a BeginMenu() from outside another menu or a menu-bar won't be closable with the Left direction.
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.NavMoveDir == ImGuiDir_Left && NavMoveRequestButNoResultYet() && window->DC.LayoutType == ImGuiLayoutType_Vertical)
        if (g.NavWindow && (g.NavWindow->RootWindowForNav->Flags & ImGuiWindowFlags_Popup) && g.NavWindow->RootWindowForNav->ParentWindow == window)
        {
            ClosePopupToLevel(g.BeginPopupStack.Size, true);
            NavMoveRequestCancel();
        }

    EndPopup();
}